

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reference_values.cxx
# Opt level: O2

gga_reference *
gen_gga_reference_values
          (gga_reference *__return_storage_ptr__,Backend backend,Kernel kern,Spin polar)

{
  int iVar1;
  int iVar2;
  size_t __new_size;
  XCKernel func;
  pair<int,_std::vector<double,_std::allocator<double>_>_> local_50;
  vector<double,_std::allocator<double>_> *local_30;
  gga_reference *local_28;
  
  (__return_storage_ptr__->vsigma).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vsigma).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vrho).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vrho).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->exc).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->vrho).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->exc).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->exc).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->sigma).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->sigma).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->rho).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->sigma).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->rho).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->rho).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vsigma).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  load_reference_density(&local_50,polar);
  local_30 = &__return_storage_ptr__->rho;
  local_28 = __return_storage_ptr__;
  std::tuple<int&,std::vector<double,std::allocator<double>>&>::operator=
            ((tuple<int&,std::vector<double,std::allocator<double>>&> *)&local_30,&local_50);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_50.second.super__Vector_base<double,_std::allocator<double>_>);
  load_reference_sigma(&local_50,polar);
  local_30 = &__return_storage_ptr__->sigma;
  local_28 = __return_storage_ptr__;
  std::tuple<int&,std::vector<double,std::allocator<double>>&>::operator=
            ((tuple<int&,std::vector<double,std::allocator<double>>&> *)&local_30,&local_50);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_50.second.super__Vector_base<double,_std::allocator<double>_>);
  ExchCXX::XCKernel::XCKernel((XCKernel *)&local_50,backend,kern,polar);
  std::vector<double,_std::allocator<double>_>::resize
            (&__return_storage_ptr__->exc,(long)__return_storage_ptr__->npts);
  iVar1 = __return_storage_ptr__->npts;
  iVar2 = (*(*(_func_int ***)local_50._0_8_)[7])();
  std::vector<double,_std::allocator<double>_>::resize
            (&__return_storage_ptr__->vrho,(long)iVar1 << ((byte)iVar2 & 0x3f));
  __new_size = ExchCXX::detail::XCKernelImpl::sigma_buffer_len
                         ((XCKernelImpl *)local_50._0_8_,(long)__return_storage_ptr__->npts);
  std::vector<double,_std::allocator<double>_>::resize(&__return_storage_ptr__->vsigma,__new_size);
  (*(*(_func_int ***)local_50._0_8_)[0x12])
            (local_50._0_8_,(ulong)(uint)__return_storage_ptr__->npts,
             (__return_storage_ptr__->rho).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (__return_storage_ptr__->sigma).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (__return_storage_ptr__->exc).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (__return_storage_ptr__->vrho).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (__return_storage_ptr__->vsigma).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start);
  ExchCXX::XCKernel::~XCKernel((XCKernel *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

gga_reference gen_gga_reference_values(ExchCXX::Backend backend, 
  ExchCXX::Kernel kern, ExchCXX::Spin polar) {
  
  using namespace ExchCXX;
  gga_reference ref_vals;
  std::tie( ref_vals.npts, ref_vals.rho )   = load_reference_density( polar );
  std::tie( ref_vals.npts, ref_vals.sigma ) = load_reference_sigma( polar );

  XCKernel func( backend, kern, polar );

  ref_vals.exc.resize( func.exc_buffer_len( ref_vals.npts ) );
  ref_vals.vrho.resize( func.vrho_buffer_len( ref_vals.npts ) );
  ref_vals.vsigma.resize( func.vsigma_buffer_len( ref_vals.npts ) );

  func.eval_exc_vxc( ref_vals.npts, ref_vals.rho.data(), ref_vals.sigma.data(), 
    ref_vals.exc.data(), ref_vals.vrho.data(), ref_vals.vsigma.data() );

  return ref_vals;

}